

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitalClock.cpp
# Opt level: O0

void __thiscall DigitalClock::Draw(DigitalClock *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int minute;
  int hour;
  DigitalClock *this_local;
  
  iVar1 = (**(code **)(*(long *)this->_subject + 0x28))();
  iVar2 = (**(code **)(*(long *)this->_subject + 0x30))();
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void DigitalClock::Draw () {
    // get the new values from the subject

    int hour = _subject->GetHour();
    int minute = _subject->GetMinute();
    // etc.

    // draw the digital clock
    std::cout << hour << ":" << minute << std::endl;
}